

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O2

Result<void> * __thiscall
wallet::ExternalSignerScriptPubKeyMan::DisplayAddress
          (Result<void> *__return_storage_ptr__,ExternalSignerScriptPubKeyMan *this,
          CTxDestination *dest,ExternalSigner *signer)

{
  __type_conflict1 _Var1;
  UniValue *pUVar2;
  ExternalSigner *args;
  bilingual_str *pbVar3;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  undefined1 local_1c0 [80];
  bilingual_str local_170;
  bilingual_str local_130;
  bilingual_str local_f0;
  UniValue local_b0;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args = signer;
  GetScriptForDestination((CScript *)&local_58,dest);
  (*(this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x15])
            (local_1c0 + 8,this,&local_58);
  InferDescriptor((CScript *)local_1c0,(SigningProvider *)&local_58);
  (**(code **)(*(long *)local_1c0._0_8_ + 0x20))(&local_130,local_1c0._0_8_,0);
  ExternalSigner::DisplayAddress(&local_b0,signer,&local_130.original);
  std::__cxx11::string::~string((string *)&local_130);
  key._M_str = "error";
  key._M_len = 5;
  pUVar2 = UniValue::find_value(&local_b0,key);
  if (pUVar2->typ == VSTR) {
    _(&local_130,(ConstevalStringLiteral)0x3f333a);
    tinyformat::format<std::__cxx11::string>
              (&local_f0,(tinyformat *)&local_130,(bilingual_str *)&pUVar2->val,&args->m_command);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_f0);
    pbVar3 = &local_f0;
LAB_001b472a:
    bilingual_str::~bilingual_str(pbVar3);
    pbVar3 = &local_130;
  }
  else {
    key_00._M_str = "address";
    key_00._M_len = 7;
    pUVar2 = UniValue::find_value(&local_b0,key_00);
    if (pUVar2->typ == VSTR) {
      EncodeDestination_abi_cxx11_(&local_130.original,dest);
      _Var1 = std::operator==(&pUVar2->val,&local_130.original);
      std::__cxx11::string::~string((string *)&local_130);
      if (_Var1) {
        (__return_storage_ptr__->m_variant).super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\x01';
        goto LAB_001b47c3;
      }
      _(&local_130,(ConstevalStringLiteral)0x3f3370);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)(local_1c0 + 0x10),(tinyformat *)&local_130,
                 (bilingual_str *)&pUVar2->val,&args->m_command);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                 local_1c0 + 0x10);
      pbVar3 = (bilingual_str *)(local_1c0 + 0x10);
      goto LAB_001b472a;
    }
    _(&local_170,(ConstevalStringLiteral)0x3f3354);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
               &local_170);
    pbVar3 = &local_170;
  }
  bilingual_str::~bilingual_str(pbVar3);
LAB_001b47c3:
  UniValue::~UniValue(&local_b0);
  if ((long *)local_1c0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1c0._0_8_ + 8))();
  }
  if ((long *)local_1c0._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_1c0._8_8_ + 8))();
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<void> ExternalSignerScriptPubKeyMan::DisplayAddress(const CTxDestination& dest, const ExternalSigner &signer) const
{
    // TODO: avoid the need to infer a descriptor from inside a descriptor wallet
    const CScript& scriptPubKey = GetScriptForDestination(dest);
    auto provider = GetSolvingProvider(scriptPubKey);
    auto descriptor = InferDescriptor(scriptPubKey, *provider);

    const UniValue& result = signer.DisplayAddress(descriptor->ToString());

    const UniValue& error = result.find_value("error");
    if (error.isStr()) return util::Error{strprintf(_("Signer returned error: %s"), error.getValStr())};

    const UniValue& ret_address = result.find_value("address");
    if (!ret_address.isStr()) return util::Error{_("Signer did not echo address")};

    if (ret_address.getValStr() != EncodeDestination(dest)) {
        return util::Error{strprintf(_("Signer echoed unexpected address %s"), ret_address.getValStr())};
    }

    return util::Result<void>();
}